

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::JSPrinter::printAssign(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Assign *pAVar2;
  
  pAVar2 = cashew::Value::asAssign(node.inst);
  printChild(this,(pAVar2->super_Value).field_1.ref.inst,node,-1);
  space(this);
  maybeSpace(this,'=');
  ensure(this,1);
  sVar1 = this->used;
  this->used = sVar1 + 1;
  this->buffer[sVar1] = '=';
  space(this);
  printChild(this,(pAVar2->value_).inst,node,1);
  return;
}

Assistant:

void printAssign(Ref node) {
    auto* assign = node->asAssign();
    printChild(assign->target(), node, -1);
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }